

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURL_conflict * curl_easy_duphandle(Curl_easy *data)

{
  curl_mimepart *part;
  undefined1 *puVar1;
  CURLcode CVar2;
  Curl_easy *data_00;
  size_t length;
  char *pcVar3;
  CookieInfo *pCVar4;
  curl_slist *pcVar5;
  hsts *h;
  long lVar6;
  
  data_00 = (Curl_easy *)(*Curl_ccalloc)(1,0x1450);
  if (data_00 == (Curl_easy *)0x0) {
    return (CURL_conflict *)0x0;
  }
  (data_00->set).buffer_size = (data->set).buffer_size;
  memcpy(&data_00->set,&data->set,0x8c8);
  part = &(data_00->set).mimepost;
  Curl_mime_initpart(part);
  memset((data_00->set).str,0,0x2c0);
  lVar6 = 0x6e0;
  do {
    if (lVar6 == 0x950) {
      lVar6 = 0x960;
      goto LAB_0059fb3c;
    }
    CVar2 = Curl_setstropt((char **)((long)&data_00->magic + lVar6),
                           *(char **)((long)&data->magic + lVar6));
    lVar6 = lVar6 + 8;
  } while (CVar2 == CURLE_OK);
  goto LAB_0059fbd1;
  while( true ) {
    CVar2 = Curl_setblobopt((curl_blob **)((long)&data_00->magic + lVar6),
                            *(curl_blob **)((long)&data->magic + lVar6));
    lVar6 = lVar6 + 8;
    if (CVar2 != CURLE_OK) break;
LAB_0059fb3c:
    if (lVar6 == 0x9a0) {
      pcVar3 = (data->set).str[0x4f];
      if (pcVar3 != (char *)0x0) {
        lVar6 = (data->set).postfieldsize;
        if (lVar6 == -1) {
          pcVar3 = (*Curl_cstrdup)(pcVar3);
        }
        else {
          length = curlx_sotouz(lVar6);
          pcVar3 = (char *)Curl_memdup(pcVar3,length);
        }
        (data_00->set).str[0x4f] = pcVar3;
        if (pcVar3 == (char *)0x0) break;
        (data_00->set).postfields = pcVar3;
      }
      CVar2 = Curl_mime_duppart(data_00,part,&(data->set).mimepost);
      if ((data->set).resolve != (curl_slist *)0x0) {
        (data_00->state).resolve = (data_00->set).resolve;
      }
      if (CVar2 != CURLE_OK) break;
      Curl_dyn_init(&(data_00->state).headerb,0x19000);
      (data_00->state).conn_cache = (conncache *)0x0;
      data_00->id = -1;
      *(undefined4 *)&(data_00->state).lastconnect_id = 0xffffffff;
      *(undefined4 *)((long)&(data_00->state).lastconnect_id + 4) = 0xffffffff;
      *(undefined4 *)&(data_00->state).recent_conn_id = 0xffffffff;
      *(undefined4 *)((long)&(data_00->state).recent_conn_id + 4) = 0xffffffff;
      (data_00->progress).flags = (data->progress).flags;
      (data_00->progress).field_0x18c =
           (data_00->progress).field_0x18c & 0xfe | (data->progress).field_0x18c & 1;
      (data_00->state).cookielist = (curl_slist *)0x0;
      if ((data->cookies != (CookieInfo *)0x0) && (((data->state).field_0x74d & 0x20) != 0)) {
        pCVar4 = Curl_cookie_init(data_00,(char *)0x0,data_00->cookies,
                                  SUB41((*(uint *)&(data->set).field_0x8ba & 8) >> 3,0));
        data_00->cookies = pCVar4;
        if (pCVar4 == (CookieInfo *)0x0) break;
      }
      pcVar5 = (data->state).cookielist;
      if (pcVar5 != (curl_slist *)0x0) {
        pcVar5 = Curl_slist_duplicate(pcVar5);
        (data_00->state).cookielist = pcVar5;
        if (pcVar5 == (curl_slist *)0x0) break;
      }
      pcVar3 = (data->state).url;
      if (pcVar3 != (char *)0x0) {
        pcVar3 = (*Curl_cstrdup)(pcVar3);
        (data_00->state).url = pcVar3;
        if (pcVar3 == (char *)0x0) break;
        puVar1 = &(data_00->state).field_0x74e;
        *puVar1 = *puVar1 | 1;
      }
      pcVar3 = (data->state).referer;
      if (pcVar3 != (char *)0x0) {
        pcVar3 = (*Curl_cstrdup)(pcVar3);
        (data_00->state).referer = pcVar3;
        if (pcVar3 == (char *)0x0) break;
        puVar1 = &(data_00->state).field_0x74e;
        *puVar1 = *puVar1 | 2;
      }
      pcVar3 = (data_00->set).str[0x29];
      if ((pcVar3 != (char *)0x0) &&
         (CVar2 = Curl_ssl_set_engine(data_00,pcVar3), CVar2 != CURLE_OK)) break;
      if (data->hsts != (hsts *)0x0) {
        h = Curl_hsts_init();
        data_00->hsts = h;
        if (h == (hsts *)0x0) break;
        pcVar3 = (data_00->set).str[0x45];
        if (pcVar3 != (char *)0x0) {
          Curl_hsts_loadfile(data_00,h,pcVar3);
          h = data_00->hsts;
        }
        Curl_hsts_loadcb(data_00,h);
      }
      Curl_initinfo(data_00);
      data_00->magic = 0xc0dedbad;
      return data_00;
    }
  }
LAB_0059fbd1:
  (*Curl_cfree)(data_00->cookies);
  (*Curl_cfree)((data_00->state).buffer);
  Curl_dyn_free(&(data_00->state).headerb);
  Curl_hsts_cleanup(&data_00->hsts);
  Curl_freeset(data_00);
  (*Curl_cfree)(data_00);
  return (CURL_conflict *)0x0;
}

Assistant:

struct Curl_easy *curl_easy_duphandle(struct Curl_easy *data)
{
  struct Curl_easy *outcurl = calloc(1, sizeof(struct Curl_easy));
  if(!outcurl)
    goto fail;

  /*
   * We setup a few buffers we need. We should probably make them
   * get setup on-demand in the code, as that would probably decrease
   * the likeliness of us forgetting to init a buffer here in the future.
   */
  outcurl->set.buffer_size = data->set.buffer_size;

  /* copy all userdefined values */
  if(dupset(outcurl, data))
    goto fail;

  Curl_dyn_init(&outcurl->state.headerb, CURL_MAX_HTTP_HEADER);

  /* the connection cache is setup on demand */
  outcurl->state.conn_cache = NULL;
  outcurl->state.lastconnect_id = -1;
  outcurl->state.recent_conn_id = -1;
  outcurl->id = -1;

  outcurl->progress.flags    = data->progress.flags;
  outcurl->progress.callback = data->progress.callback;

#ifndef CURL_DISABLE_COOKIES
  outcurl->state.cookielist = NULL;
  if(data->cookies && data->state.cookie_engine) {
    /* If cookies are enabled in the parent handle, we enable them
       in the clone as well! */
    outcurl->cookies = Curl_cookie_init(outcurl, NULL, outcurl->cookies,
                                        data->set.cookiesession);
    if(!outcurl->cookies)
      goto fail;
  }

  if(data->state.cookielist) {
    outcurl->state.cookielist = Curl_slist_duplicate(data->state.cookielist);
    if(!outcurl->state.cookielist)
      goto fail;
  }
#endif

  if(data->state.url) {
    outcurl->state.url = strdup(data->state.url);
    if(!outcurl->state.url)
      goto fail;
    outcurl->state.url_alloc = TRUE;
  }

  if(data->state.referer) {
    outcurl->state.referer = strdup(data->state.referer);
    if(!outcurl->state.referer)
      goto fail;
    outcurl->state.referer_alloc = TRUE;
  }

  /* Reinitialize an SSL engine for the new handle
   * note: the engine name has already been copied by dupset */
  if(outcurl->set.str[STRING_SSL_ENGINE]) {
    if(Curl_ssl_set_engine(outcurl, outcurl->set.str[STRING_SSL_ENGINE]))
      goto fail;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(data->asi) {
    outcurl->asi = Curl_altsvc_init();
    if(!outcurl->asi)
      goto fail;
    if(outcurl->set.str[STRING_ALTSVC])
      (void)Curl_altsvc_load(outcurl->asi, outcurl->set.str[STRING_ALTSVC]);
  }
#endif
#ifndef CURL_DISABLE_HSTS
  if(data->hsts) {
    outcurl->hsts = Curl_hsts_init();
    if(!outcurl->hsts)
      goto fail;
    if(outcurl->set.str[STRING_HSTS])
      (void)Curl_hsts_loadfile(outcurl,
                               outcurl->hsts, outcurl->set.str[STRING_HSTS]);
    (void)Curl_hsts_loadcb(outcurl, outcurl->hsts);
  }
#endif

#ifdef CURLRES_ASYNCH
  /* Clone the resolver handle, if present, for the new handle */
  if(Curl_resolver_duphandle(outcurl,
                             &outcurl->state.async.resolver,
                             data->state.async.resolver))
    goto fail;
#endif

#ifdef USE_ARES
  {
    CURLcode rc;

    rc = Curl_set_dns_servers(outcurl, data->set.str[STRING_DNS_SERVERS]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;

    rc = Curl_set_dns_interface(outcurl, data->set.str[STRING_DNS_INTERFACE]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;

    rc = Curl_set_dns_local_ip4(outcurl, data->set.str[STRING_DNS_LOCAL_IP4]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;

    rc = Curl_set_dns_local_ip6(outcurl, data->set.str[STRING_DNS_LOCAL_IP6]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;
  }
#endif /* USE_ARES */

  Curl_initinfo(outcurl);

  outcurl->magic = CURLEASY_MAGIC_NUMBER;

  /* we reach this point and thus we are OK */

  return outcurl;

fail:

  if(outcurl) {
#ifndef CURL_DISABLE_COOKIES
    free(outcurl->cookies);
#endif
    free(outcurl->state.buffer);
    Curl_dyn_free(&outcurl->state.headerb);
    Curl_altsvc_cleanup(&outcurl->asi);
    Curl_hsts_cleanup(&outcurl->hsts);
    Curl_freeset(outcurl);
    free(outcurl);
  }

  return NULL;
}